

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay_linux.hpp
# Opt level: O0

bool __thiscall
ProcessProgress::start_child_process
          (ProcessProgress *this,vector<ProcessProgress,_std::allocator<ProcessProgress>_> *siblings
          )

{
  bool bVar1;
  int iVar2;
  reference pPVar3;
  ulong uVar4;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  undefined1 local_1c0 [8];
  Options copy_opts;
  int fd_dev_null;
  ProcessProgress *sibling;
  iterator __end3;
  iterator __begin3;
  vector<ProcessProgress,_std::allocator<ProcessProgress>_> *__range3;
  epoll_event event;
  pid_t new_pid;
  int input_fds [2];
  int crash_fds [2];
  vector<ProcessProgress,_std::allocator<ProcessProgress>_> *siblings_local;
  ProcessProgress *this_local;
  
  this->graphics_progress = -1;
  this->compute_progress = -1;
  this->raytracing_progress = -1;
  this->stopped = false;
  if (((this->start_graphics_index < this->end_graphics_index) ||
      (this->start_compute_index < this->end_compute_index)) ||
     (this->start_raytracing_index < this->end_raytracing_index)) {
    iVar2 = pipe(input_fds);
    if (iVar2 < 0) {
      this_local._7_1_ = false;
    }
    else {
      iVar2 = pipe((int *)((long)&event.data + 4));
      if (iVar2 < 0) {
        this_local._7_1_ = false;
      }
      else {
        event.data.fd = fork();
        if (event.data.fd < 1) {
          if (event.data.fd == 0) {
            close(Global::signal_fd);
            close(Global::epoll_fd);
            close(Global::timer_fd);
            close(input_fds[0]);
            close(new_pid);
            if (-1 < Global::control_fd) {
              close(Global::control_fd);
            }
            iVar2 = pthread_sigmask(2,(__sigset_t *)Global::old_mask,(__sigset_t *)0x0);
            if (iVar2 == 0) {
              __end3 = std::vector<ProcessProgress,_std::allocator<ProcessProgress>_>::begin
                                 (siblings);
              sibling = (ProcessProgress *)
                        std::vector<ProcessProgress,_std::allocator<ProcessProgress>_>::end
                                  (siblings);
              while (bVar1 = __gnu_cxx::operator!=
                                       (&__end3,(__normal_iterator<ProcessProgress_*,_std::vector<ProcessProgress,_std::allocator<ProcessProgress>_>_>
                                                 *)&sibling), bVar1) {
                pPVar3 = __gnu_cxx::
                         __normal_iterator<ProcessProgress_*,_std::vector<ProcessProgress,_std::allocator<ProcessProgress>_>_>
                         ::operator*(&__end3);
                if (pPVar3 != this) {
                  if (-1 < pPVar3->crash_fd) {
                    close(pPVar3->crash_fd);
                    pPVar3->crash_fd = -1;
                  }
                  if (-1 < pPVar3->timer_fd) {
                    close(pPVar3->timer_fd);
                    pPVar3->timer_fd = -1;
                  }
                  if (-1 < pPVar3->watchdog_timer_fd) {
                    close(pPVar3->watchdog_timer_fd);
                    pPVar3->watchdog_timer_fd = -1;
                  }
                }
                __gnu_cxx::
                __normal_iterator<ProcessProgress_*,_std::vector<ProcessProgress,_std::allocator<ProcessProgress>_>_>
                ::operator++(&__end3);
              }
              iVar2 = dup2(input_fds[1],1);
              if (iVar2 < 0) {
                this_local._7_1_ = true;
              }
              else {
                iVar2 = dup2(event.data.u64._4_4_,0);
                if (-1 < iVar2) {
                  close(input_fds[1]);
                  close(event.data.u64._4_4_);
                  if (((Global::quiet_slave & 1) != 0) &&
                     (copy_opts._340_4_ = open("/dev/null",1), -1 < (int)copy_opts._340_4_)) {
                    dup2(copy_opts._340_4_,2);
                    close(copy_opts._340_4_);
                  }
                  ThreadedReplayer::Options::Options
                            ((Options *)local_1c0,(Options *)Global::base_replayer_options);
                  copy_opts.pipeline_hash._0_4_ = this->start_graphics_index;
                  copy_opts.pipeline_hash._4_4_ = this->end_graphics_index;
                  copy_opts.start_graphics_index = this->start_compute_index;
                  copy_opts.end_graphics_index = this->end_compute_index;
                  copy_opts.start_compute_index = this->start_raytracing_index;
                  copy_opts.end_compute_index = this->end_raytracing_index;
                  copy_opts.start_raytracing_index = (uint)Global::control_block;
                  copy_opts.end_raytracing_index = Global::control_block._4_4_;
                  uVar4 = std::__cxx11::string::empty();
                  if (((uVar4 & 1) == 0) && (this->index != 0)) {
                    std::__cxx11::string::operator+=((string *)&copy_opts,".");
                    std::__cxx11::to_string(&local_1e0,this->index);
                    std::__cxx11::string::operator+=((string *)&copy_opts,(string *)&local_1e0);
                    std::__cxx11::string::~string((string *)&local_1e0);
                  }
                  uVar4 = std::__cxx11::string::empty();
                  if (((uVar4 & 1) == 0) && (this->index != 0)) {
                    std::__cxx11::string::operator+=
                              ((string *)
                               (copy_opts.on_disk_pipeline_cache_path.field_2._M_local_buf + 8),".")
                    ;
                    std::__cxx11::to_string(&local_200,this->index);
                    std::__cxx11::string::operator+=
                              ((string *)
                               (copy_opts.on_disk_pipeline_cache_path.field_2._M_local_buf + 8),
                               (string *)&local_200);
                    std::__cxx11::string::~string((string *)&local_200);
                  }
                  uVar4 = std::__cxx11::string::empty();
                  if (((uVar4 & 1) == 0) && (this->index != 0)) {
                    std::__cxx11::string::operator+=
                              ((string *)
                               (copy_opts.on_disk_module_identifier_path.field_2._M_local_buf + 8),
                               ".");
                    std::__cxx11::to_string(&local_220,this->index);
                    std::__cxx11::string::operator+=
                              ((string *)
                               (copy_opts.on_disk_module_identifier_path.field_2._M_local_buf + 8),
                               (string *)&local_220);
                    std::__cxx11::string::~string((string *)&local_220);
                  }
                  uVar4 = std::__cxx11::string::empty();
                  if (((uVar4 & 1) == 0) && (this->index != 0)) {
                    std::__cxx11::string::operator+=
                              ((string *)
                               (copy_opts.on_disk_validation_blacklist_path.field_2._M_local_buf + 8
                               ),".");
                    std::__cxx11::to_string(&local_240,this->index);
                    std::__cxx11::string::operator+=
                              ((string *)
                               (copy_opts.on_disk_validation_blacklist_path.field_2._M_local_buf + 8
                               ),(string *)&local_240);
                    std::__cxx11::string::~string((string *)&local_240);
                  }
                  iVar2 = run_slave_process((Options *)Global::device_options,(Options *)local_1c0,
                                            (vector<const_char_*,_std::allocator<const_char_*>_> *)
                                            Global::databases);
                  exit(iVar2);
                }
                this_local._7_1_ = true;
              }
            }
            else {
              this_local._7_1_ = true;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this->crash_fd = input_fds[0];
          this->pid = event.data.fd;
          this->heartbeats = 1;
          send_faulty_modules_and_close(new_pid);
          close(input_fds[1]);
          close(event.data.u64._4_4_);
          Global::active_processes = Global::active_processes + 1;
          memset(&__range3,0,0xc);
          __range3._4_4_ = this->index;
          __range3._0_4_ = 0x2001;
          iVar2 = epoll_ctl(Global::epoll_fd,1,this->crash_fd,(epoll_event *)&__range3);
          if (iVar2 < 0) {
            fprintf(_stderr,"Fossilize ERROR: Failed to add file to epoll.\n");
            fflush(_stderr);
            this_local._7_1_ = false;
          }
          else {
            this_local._7_1_ = true;
          }
        }
      }
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ProcessProgress::start_child_process(vector<ProcessProgress> &siblings)
{
	graphics_progress = -1;
	compute_progress = -1;
	raytracing_progress = -1;
	stopped = false;

	if (start_graphics_index >= end_graphics_index &&
	    start_compute_index >= end_compute_index &&
	    start_raytracing_index >= end_raytracing_index)
	{
		// Nothing to do.
		return true;
	}

	int crash_fds[2];
	int input_fds[2];
	if (pipe(crash_fds) < 0)
		return false;
	if (pipe(input_fds) < 0)
		return false;

	pid_t new_pid = fork(); // Fork off a child.
	if (new_pid > 0)
	{
		// We're the parent, keep track of the process in a thread to avoid a lot of complex multiplexing code.
		crash_fd = crash_fds[0];
		pid = new_pid;
		heartbeats = 1;

		send_faulty_modules_and_close(input_fds[1]);
		close(crash_fds[1]);
		close(input_fds[0]);
		Global::active_processes++;

		epoll_event event = {};
		event.data.u32 = index;
		event.events = EPOLLIN | EPOLLRDHUP;
		if (epoll_ctl(Global::epoll_fd, EPOLL_CTL_ADD, crash_fd, &event) < 0)
		{
			LOGE("Failed to add file to epoll.\n");
			return false;
		}

		return true;
	}
	else if (new_pid == 0)
	{
		// Close various FDs we won't use.
		close(Global::signal_fd);
		close(Global::epoll_fd);
		close(Global::timer_fd);
		close(crash_fds[0]);
		close(input_fds[1]);
		if (Global::control_fd >= 0)
			close(Global::control_fd);

		// We're the child process.
		// Unblock the signal mask.
		if (pthread_sigmask(SIG_SETMASK, &Global::old_mask, nullptr) != 0)
			return EXIT_FAILURE;

		// Make sure we don't hold unrelated epoll sensitive FDs open.
		for (auto &sibling : siblings)
		{
			if (&sibling == this)
				continue;

			if (sibling.crash_fd >= 0)
			{
				::close(sibling.crash_fd);
				sibling.crash_fd = -1;
			}

			if (sibling.timer_fd >= 0)
			{
				close(sibling.timer_fd);
				sibling.timer_fd = -1;
			}

			if (sibling.watchdog_timer_fd >= 0)
			{
				close(sibling.watchdog_timer_fd);
				sibling.watchdog_timer_fd = -1;
			}
		}

		// Override stdin/stdout.
		if (dup2(crash_fds[1], STDOUT_FILENO) < 0)
			return EXIT_FAILURE;
		if (dup2(input_fds[0], STDIN_FILENO) < 0)
			return EXIT_FAILURE;

		close(crash_fds[1]);
		close(input_fds[0]);

		// Redirect stderr to /dev/null if the child process is supposed to be quiet.
		if (Global::quiet_slave)
		{
			int fd_dev_null = open("/dev/null", O_WRONLY);
			if (fd_dev_null >= 0)
			{
				dup2(fd_dev_null, STDERR_FILENO);
				close(fd_dev_null);
			}
		}

		// Run the slave process.
		auto copy_opts = Global::base_replayer_options;
		copy_opts.start_graphics_index = start_graphics_index;
		copy_opts.end_graphics_index = end_graphics_index;
		copy_opts.start_compute_index = start_compute_index;
		copy_opts.end_compute_index = end_compute_index;
		copy_opts.start_raytracing_index = start_raytracing_index;
		copy_opts.end_raytracing_index = end_raytracing_index;
		copy_opts.control_block = Global::control_block;
		if (!copy_opts.on_disk_pipeline_cache_path.empty() && index != 0)
		{
			copy_opts.on_disk_pipeline_cache_path += ".";
			copy_opts.on_disk_pipeline_cache_path += std::to_string(index);
		}

		if (!copy_opts.on_disk_validation_cache_path.empty() && index != 0)
		{
			copy_opts.on_disk_validation_cache_path += ".";
			copy_opts.on_disk_validation_cache_path += std::to_string(index);
		}

		if (!copy_opts.pipeline_stats_path.empty() && index != 0)
		{
			copy_opts.pipeline_stats_path += ".";
			copy_opts.pipeline_stats_path += std::to_string(index);
		}

		if (!copy_opts.on_disk_module_identifier_path.empty() && index != 0)
		{
			copy_opts.on_disk_module_identifier_path += ".";
			copy_opts.on_disk_module_identifier_path += std::to_string(index);
		}

		exit(run_slave_process(Global::device_options, copy_opts, Global::databases));
	}
	else
		return false;
}